

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

char fmt::v5::internal::thousands_sep<char>(locale_provider *lp)

{
  char cVar1;
  locale local_20;
  locale local_18;
  locale loc;
  locale_provider *lp_local;
  
  _loc = lp;
  if (lp == (locale_provider *)0x0) {
    std::locale::locale(&local_18.locale_);
  }
  else {
    (*lp->_vptr_locale_provider[2])();
    locale::get(&local_18);
    locale::~locale(&local_20);
  }
  std::use_facet<std::__cxx11::numpunct<char>>(&local_18.locale_);
  cVar1 = std::__cxx11::numpunct<char>::thousands_sep();
  std::locale::~locale(&local_18.locale_);
  return cVar1;
}

Assistant:

FMT_FUNC Char internal::thousands_sep(locale_provider *lp) {
  std::locale loc = lp ? lp->locale().get() : std::locale();
  return std::use_facet<std::numpunct<Char>>(loc).thousands_sep();
}